

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O0

int asn1_template_ex_i2d
              (ASN1_VALUE **pval,uchar **out,ASN1_TEMPLATE *tt,int tag,int iclass,int optional)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  bool local_87;
  ASN1_VALUE *pAStack_80;
  int tmplen;
  ASN1_VALUE *skitem;
  int local_70;
  int sklen;
  int skcontlen;
  int skaclass;
  int sktag;
  int isset;
  stack_st_ASN1_VALUE *sk;
  ulong uStack_50;
  uint32_t flags;
  size_t j;
  int local_40;
  int tclass;
  int ttag;
  int ret;
  int i;
  int optional_local;
  int iclass_local;
  int tag_local;
  ASN1_TEMPLATE *tt_local;
  uchar **out_local;
  ASN1_VALUE **pval_local;
  
  sk._4_4_ = tt->flags;
  ret = optional;
  i = iclass;
  optional_local = tag;
  _iclass_local = tt;
  tt_local = (ASN1_TEMPLATE *)out;
  out_local = (uchar **)pval;
  if ((iclass & 0xc0U) != iclass) {
    __assert_fail("(iclass & ASN1_TFLG_TAG_CLASS) == iclass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0xf0,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  if (tag == -1 && iclass != 0) {
    __assert_fail("tag != -1 || iclass == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0xf2,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  if ((sk._4_4_ & 0x18) == 0) {
    if (tag == -1) {
      local_40 = -1;
      j._4_4_ = 0;
    }
    else {
      j._4_4_ = iclass & 0xc0;
      local_40 = tag;
    }
  }
  else {
    if (tag != -1) {
      ERR_put_error(0xc,0,0xc1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                    ,0xfa);
      return -1;
    }
    local_40 = tt->tag;
    j._4_4_ = sk._4_4_ & 0xc0;
  }
  if (optional == 0 || (sk._4_4_ & 1) == 0) {
    local_87 = optional != 0 || (sk._4_4_ & 1) != 0;
    ret = (int)local_87;
    if ((sk._4_4_ & 6) == 0) {
      if ((sk._4_4_ & 0x10) == 0) {
        pval_local._4_4_ = asn1_item_ex_i2d_opt(pval,out,tt->item,local_40,j._4_4_,ret);
      }
      else {
        ttag = asn1_item_ex_i2d_opt(pval,(uchar **)0x0,tt->item,-1,0,ret);
        pval_local._4_4_ = ttag;
        if (0 < ttag) {
          tclass = ASN1_object_size(1,ttag,local_40);
          if ((tt_local != (ASN1_TEMPLATE *)0x0) && (tclass != -1)) {
            ASN1_put_object((uchar **)tt_local,1,ttag,local_40,j._4_4_);
            iVar2 = ASN1_item_ex_i2d((ASN1_VALUE **)out_local,(uchar **)tt_local,
                                     (ASN1_ITEM *)_iclass_local->item,-1,0);
            if (iVar2 < 0) {
              return -1;
            }
          }
          pval_local._4_4_ = tclass;
        }
      }
    }
    else {
      _sktag = *pval;
      if (*pval == (ASN1_VALUE *)0x0) {
        if (ret == 0) {
          ERR_put_error(0xc,0,0x9b,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                        ,0x11e);
          pval_local._4_4_ = -1;
        }
        else {
          pval_local._4_4_ = 0;
        }
      }
      else {
        if ((sk._4_4_ & 2) == 0) {
          skaclass = 0;
        }
        else {
          skaclass = 1;
          if ((sk._4_4_ & 4) != 0) {
            __assert_fail("(flags & ASN1_TFLG_SEQUENCE_OF) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                          ,0x126,
                          "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                         );
          }
        }
        if ((local_40 == -1) || ((sk._4_4_ & 0x10) != 0)) {
          sklen = 0;
          if (skaclass == 0) {
            skcontlen = 0x10;
          }
          else {
            skcontlen = 0x11;
          }
        }
        else {
          skcontlen = local_40;
          sklen = j._4_4_;
        }
        local_70 = 0;
        for (uStack_50 = 0; uVar1 = uStack_50,
            sVar3 = sk_ASN1_VALUE_num((stack_st_ASN1_VALUE *)_sktag), uVar1 < sVar3;
            uStack_50 = uStack_50 + 1) {
          pAStack_80 = sk_ASN1_VALUE_value((stack_st_ASN1_VALUE *)_sktag,uStack_50);
          iVar2 = ASN1_item_ex_i2d((ASN1_VALUE **)&stack0xffffffffffffff80,(uchar **)0x0,
                                   (ASN1_ITEM *)_iclass_local->item,-1,0);
          if ((iVar2 == -1) || (0x7fffffff - iVar2 < local_70)) {
            return -1;
          }
          local_70 = iVar2 + local_70;
        }
        skitem._4_4_ = ASN1_object_size(1,local_70,skcontlen);
        if (skitem._4_4_ == -1) {
          pval_local._4_4_ = -1;
        }
        else {
          tclass = skitem._4_4_;
          if ((sk._4_4_ & 0x10) != 0) {
            tclass = ASN1_object_size(1,skitem._4_4_,local_40);
          }
          if ((tt_local == (ASN1_TEMPLATE *)0x0) || (tclass == -1)) {
            pval_local._4_4_ = tclass;
          }
          else {
            if ((sk._4_4_ & 0x10) != 0) {
              ASN1_put_object((uchar **)tt_local,1,skitem._4_4_,local_40,j._4_4_);
            }
            ASN1_put_object((uchar **)tt_local,1,local_70,skcontlen,sklen);
            iVar2 = asn1_set_seq_out((stack_st_ASN1_VALUE *)_sktag,(uchar **)tt_local,local_70,
                                     _iclass_local->item,skaclass);
            if (iVar2 == 0) {
              pval_local._4_4_ = -1;
            }
            else {
              pval_local._4_4_ = tclass;
            }
          }
        }
      }
    }
    return pval_local._4_4_;
  }
  __assert_fail("!optional || (flags & ASN1_TFLG_OPTIONAL) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                ,0x10d,
                "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
               );
}

Assistant:

static int asn1_template_ex_i2d(ASN1_VALUE **pval, unsigned char **out,
                                const ASN1_TEMPLATE *tt, int tag, int iclass,
                                int optional) {
  int i, ret, ttag, tclass;
  size_t j;
  uint32_t flags = tt->flags;

  // Historically, |iclass| was repurposed to pass additional flags into the
  // encoding process.
  assert((iclass & ASN1_TFLG_TAG_CLASS) == iclass);
  // If not overridding the tag, |iclass| is ignored and should be zero.
  assert(tag != -1 || iclass == 0);

  // Work out tag and class to use: tagging may come either from the
  // template or the arguments, not both because this would create
  // ambiguity.
  if (flags & ASN1_TFLG_TAG_MASK) {
    // Error if argument and template tagging
    if (tag != -1) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
      return -1;
    }
    // Get tagging from template
    ttag = tt->tag;
    tclass = flags & ASN1_TFLG_TAG_CLASS;
  } else if (tag != -1) {
    // No template tagging, get from arguments
    ttag = tag;
    tclass = iclass & ASN1_TFLG_TAG_CLASS;
  } else {
    ttag = -1;
    tclass = 0;
  }

  // The template may itself by marked as optional, or this may be the template
  // of an |ASN1_ITEM_TEMPLATE| type which was contained inside an outer
  // optional template. (They cannot both be true because the
  // |ASN1_ITEM_TEMPLATE| codepath rejects optional templates.)
  assert(!optional || (flags & ASN1_TFLG_OPTIONAL) == 0);
  optional = optional || (flags & ASN1_TFLG_OPTIONAL) != 0;

  // At this point 'ttag' contains the outer tag to use, and 'tclass' is the
  // class.

  if (flags & ASN1_TFLG_SK_MASK) {
    // SET OF, SEQUENCE OF
    STACK_OF(ASN1_VALUE) *sk = (STACK_OF(ASN1_VALUE) *)*pval;
    int isset, sktag, skaclass;
    int skcontlen, sklen;
    ASN1_VALUE *skitem;

    if (!*pval) {
      if (optional) {
        return 0;
      }
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
      return -1;
    }

    if (flags & ASN1_TFLG_SET_OF) {
      isset = 1;
      // Historically, types with both bits set were mutated when
      // serialized to apply the sort. We no longer support this.
      assert((flags & ASN1_TFLG_SEQUENCE_OF) == 0);
    } else {
      isset = 0;
    }

    // Work out inner tag value: if EXPLICIT or no tagging use underlying
    // type.
    if ((ttag != -1) && !(flags & ASN1_TFLG_EXPTAG)) {
      sktag = ttag;
      skaclass = tclass;
    } else {
      skaclass = V_ASN1_UNIVERSAL;
      if (isset) {
        sktag = V_ASN1_SET;
      } else {
        sktag = V_ASN1_SEQUENCE;
      }
    }

    // Determine total length of items
    skcontlen = 0;
    for (j = 0; j < sk_ASN1_VALUE_num(sk); j++) {
      int tmplen;
      skitem = sk_ASN1_VALUE_value(sk, j);
      tmplen = ASN1_item_ex_i2d(&skitem, NULL, ASN1_ITEM_ptr(tt->item), -1, 0);
      if (tmplen == -1 || (skcontlen > INT_MAX - tmplen)) {
        return -1;
      }
      skcontlen += tmplen;
    }
    sklen = ASN1_object_size(/*constructed=*/1, skcontlen, sktag);
    if (sklen == -1) {
      return -1;
    }
    // If EXPLICIT need length of surrounding tag
    if (flags & ASN1_TFLG_EXPTAG) {
      ret = ASN1_object_size(/*constructed=*/1, sklen, ttag);
    } else {
      ret = sklen;
    }

    if (!out || ret == -1) {
      return ret;
    }

    // Now encode this lot...
    // EXPLICIT tag
    if (flags & ASN1_TFLG_EXPTAG) {
      ASN1_put_object(out, /*constructed=*/1, sklen, ttag, tclass);
    }
    // SET or SEQUENCE and IMPLICIT tag
    ASN1_put_object(out, /*constructed=*/1, skcontlen, sktag, skaclass);
    // And the stuff itself
    if (!asn1_set_seq_out(sk, out, skcontlen, ASN1_ITEM_ptr(tt->item), isset)) {
      return -1;
    }
    return ret;
  }

  if (flags & ASN1_TFLG_EXPTAG) {
    // EXPLICIT tagging
    // Find length of tagged item
    i = asn1_item_ex_i2d_opt(pval, NULL, ASN1_ITEM_ptr(tt->item), -1, 0,
                             optional);
    if (i <= 0) {
      return i;
    }
    // Find length of EXPLICIT tag
    ret = ASN1_object_size(/*constructed=*/1, i, ttag);
    if (out && ret != -1) {
      // Output tag and item
      ASN1_put_object(out, /*constructed=*/1, i, ttag, tclass);
      if (ASN1_item_ex_i2d(pval, out, ASN1_ITEM_ptr(tt->item), -1, 0) < 0) {
        return -1;
      }
    }
    return ret;
  }

  // Either normal or IMPLICIT tagging
  return asn1_item_ex_i2d_opt(pval, out, ASN1_ITEM_ptr(tt->item), ttag, tclass,
                              optional);
}